

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

Dec_Graph_t *
Abc_NodeRefactor(Abc_ManRef_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins,int fUpdateLevel,int fUseZeros,
                int fUseDcs,int fVerbose)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  word *pTruth;
  abctime aVar9;
  Dec_Graph_t *pDVar10;
  Kit_Graph_t *pGraph_00;
  void *pvVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Dec_Graph_t *pGraph;
  int local_44;
  
  iVar7 = vFanins->nSize;
  iVar6 = 1 << ((char)p->nNodeSizeMax - 6U & 0x1f);
  if (p->nNodeSizeMax < 7) {
    iVar6 = 1;
  }
  p->nNodesConsidered = p->nNodesConsidered + 1;
  if (fUpdateLevel == 0) {
    local_44 = 1000000000;
  }
  else {
    local_44 = Abc_ObjRequiredLevel(pNode);
  }
  aVar8 = Abc_Clock();
  pTruth = Abc_NodeConeTruth(p->vVars,p->vFuncs,iVar6,pNode,vFanins,p->vVisited);
  aVar9 = Abc_Clock();
  p->timeTru = p->timeTru + (aVar9 - aVar8);
  if (pTruth != (word *)0x0) {
    iVar6 = Abc_NodeConeIsConst0(pTruth,iVar7);
    if ((iVar6 != 0) || (iVar6 = Abc_NodeConeIsConst1(pTruth,iVar7), iVar6 != 0)) {
      iVar6 = Abc_NodeMffcSize(pNode);
      p->nLastGain = iVar6;
      uVar1 = p->nNodesRefactored;
      uVar3 = p->nNodesGained;
      p->nNodesRefactored = uVar1 + 1;
      p->nNodesGained = iVar6 + uVar3;
      iVar7 = Abc_NodeConeIsConst0(pTruth,iVar7);
      pDVar10 = (Dec_Graph_t *)calloc(1,0x20);
      pDVar10->fConst = 1;
      if (iVar7 == 0) {
        return pDVar10;
      }
      pDVar10->eRoot = (Dec_Edge_t)0x1;
      return pDVar10;
    }
    aVar8 = Abc_Clock();
    pGraph_00 = Kit_TruthToGraph((uint *)pTruth,iVar7,p->vMemory);
    aVar9 = Abc_Clock();
    p->timeFact = p->timeFact + (aVar9 - aVar8);
    for (iVar7 = 0; iVar7 < vFanins->nSize; iVar7 = iVar7 + 1) {
      pvVar11 = Vec_PtrEntry(vFanins,iVar7);
      *(int *)((long)pvVar11 + 0x2c) = *(int *)((long)pvVar11 + 0x2c) + 1;
    }
    pAVar5 = pNode->pNtk;
    if ((pAVar5->vTravIds).pArray == (int *)0x0) {
      uVar14 = (long)pAVar5->vObjs->nSize + 500;
      uVar15 = 0;
      iVar7 = (int)uVar14;
      if ((pAVar5->vTravIds).nCap < iVar7) {
        piVar12 = (int *)malloc(uVar14 * 4);
        (pAVar5->vTravIds).pArray = piVar12;
        if (piVar12 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar5->vTravIds).nCap = iVar7;
      }
      else {
        piVar12 = (int *)0x0;
      }
      uVar13 = 0;
      if (0 < iVar7) {
        uVar13 = uVar14 & 0xffffffff;
      }
      for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        piVar12[uVar15] = 0;
      }
      (pAVar5->vTravIds).nSize = iVar7;
    }
    iVar7 = pAVar5->nTravIds;
    pAVar5->nTravIds = iVar7 + 1;
    if (0x3ffffffe < iVar7) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    iVar7 = Abc_NodeMffcLabelAig(pNode);
    lVar17 = 8;
    for (lVar16 = 0; lVar16 < vFanins->nSize; lVar16 = lVar16 + 1) {
      pvVar11 = Vec_PtrEntry(vFanins,(int)lVar16);
      *(int *)((long)pvVar11 + 0x2c) = *(int *)((long)pvVar11 + 0x2c) + -1;
      *(void **)(&(pGraph_00->pNodes->eEdge0).field_0x0 + lVar17) = pvVar11;
      lVar17 = lVar17 + 0x18;
    }
    aVar8 = Abc_Clock();
    iVar6 = Dec_GraphToNetworkCount(pNode,(Dec_Graph_t *)pGraph_00,iVar7,local_44);
    aVar9 = Abc_Clock();
    p->timeEval = p->timeEval + (aVar9 - aVar8);
    if ((iVar6 != -1) && ((fUseZeros != 0 || (iVar7 != iVar6)))) {
      p->nLastGain = iVar7 - iVar6;
      uVar2 = p->nNodesRefactored;
      uVar4 = p->nNodesGained;
      p->nNodesRefactored = uVar2 + 1;
      p->nNodesGained = (iVar7 - iVar6) + uVar4;
      return (Dec_Graph_t *)pGraph_00;
    }
    Dec_GraphFree((Dec_Graph_t *)pGraph_00);
  }
  return (Dec_Graph_t *)0x0;
}

Assistant:

Dec_Graph_t * Abc_NodeRefactor( Abc_ManRef_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern int    Dec_GraphToNetworkCount( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax );
    int fVeryVerbose = 0;
    int nVars = Vec_PtrSize(vFanins);
    int nWordsMax = Abc_Truth6WordNum(p->nNodeSizeMax);
    Dec_Graph_t * pFForm;
    Abc_Obj_t * pFanin;
    word * pTruth;
    abctime clk;
    int i, nNodesSaved, nNodesAdded, Required;

    p->nNodesConsidered++;

    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the function of the cut
clk = Abc_Clock();
    pTruth = Abc_NodeConeTruth( p->vVars, p->vFuncs, nWordsMax, pNode, vFanins, p->vVisited );
p->timeTru += Abc_Clock() - clk;
    if ( pTruth == NULL )
        return NULL;

    // always accept the case of constant node
    if ( Abc_NodeConeIsConst0(pTruth, nVars) || Abc_NodeConeIsConst1(pTruth, nVars) )
    {
        p->nLastGain = Abc_NodeMffcSize( pNode );
        p->nNodesGained += p->nLastGain;
        p->nNodesRefactored++;
        return Abc_NodeConeIsConst0(pTruth, nVars) ? Dec_GraphCreateConst0() : Dec_GraphCreateConst1();
    }

    // get the factored form
clk = Abc_Clock();
    pFForm = (Dec_Graph_t *)Kit_TruthToGraph( (unsigned *)pTruth, nVars, p->vMemory );
p->timeFact += Abc_Clock() - clk;

    // mark the fanin boundary 
    // (can mark only essential fanins, belonging to bNodeFunc!)
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
        pFanin->vFanouts.nSize++;
    // label MFFC with current traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    nNodesSaved = Abc_NodeMffcLabelAig( pNode );
    // unmark the fanin boundary and set the fanins as leaves in the form
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
    {
        pFanin->vFanouts.nSize--;
        Dec_GraphNode(pFForm, i)->pFunc = pFanin;
    }

    // detect how many new nodes will be added (while taking into account reused nodes)
clk = Abc_Clock();
    nNodesAdded = Dec_GraphToNetworkCount( pNode, pFForm, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;
    // quit if there is no improvement
    if ( nNodesAdded == -1 || (nNodesAdded == nNodesSaved && !fUseZeros) )
    {
        Dec_GraphFree( pFForm );
        return NULL;
    }

    // compute the total gain in the number of nodes
    p->nLastGain = nNodesSaved - nNodesAdded;
    p->nNodesGained += p->nLastGain;
    p->nNodesRefactored++;

    // report the progress
    if ( fVeryVerbose )
    {
        printf( "Node %6s : ",  Abc_ObjName(pNode) );
        printf( "Cone = %2d. ", vFanins->nSize );
        printf( "FF = %2d. ",   1 + Dec_GraphNodeNum(pFForm) );
        printf( "MFFC = %2d. ", nNodesSaved );
        printf( "Add = %2d. ",  nNodesAdded );
        printf( "GAIN = %2d. ", p->nLastGain );
        printf( "\n" );
    }
    return pFForm;
}